

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O3

int mapApproxHeight(float *y,int *ids,Generator *g,SurfaceNoise *sn,int x,int z,int w,int h)

{
  double dVar1;
  int iVar2;
  Range r_00;
  bool bVar3;
  int iVar4;
  int x_00;
  void *__ptr;
  size_t __nmemb;
  int *piVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  double dVar11;
  long lVar12;
  double *pdVar13;
  int *piVar14;
  ulong uVar15;
  bool bVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int samplez;
  double d0;
  double s0;
  double s;
  double d;
  Range r;
  long local_53f8;
  long local_53d8;
  long local_53b8;
  long local_5388;
  double local_5378 [2];
  long local_5368;
  int *local_5360;
  double local_5358;
  double local_5350;
  SurfaceNoise *local_5348;
  double local_5340;
  float *local_5338;
  long local_5330;
  double local_5328;
  OctaveNoise *local_5320;
  double local_5318;
  double local_5310;
  SurfaceNoiseBeta local_5308;
  
  if (g->dim == -1) {
    iVar4 = 0x7f;
  }
  else {
    local_5348 = sn;
    if (g->dim == 1) {
      iVar4 = 1;
      if (0xb < g->mc) {
        iVar4 = mapEndSurfaceHeight(y,&g->en,sn,x,z,w,h,4,0);
      }
    }
    else {
      if (g->mc < 0x16) {
        local_5338 = y;
        if (g->mc < 2) {
          initSurfaceNoiseBeta(&local_5308,g->seed);
          if (0 < h) {
            local_53f8 = 0;
            pfVar7 = local_5338;
            do {
              if (0 < w) {
                lVar12 = 0;
                iVar4 = x * 4 + 2;
                do {
                  dVar11 = approxSurfaceBeta((BiomeNoiseBeta *)&(g->field_5).field_0,&local_5308,
                                             iVar4,(z + (int)local_53f8) * 4 + 2);
                  pfVar7[lVar12] = (float)dVar11;
                  lVar12 = lVar12 + 1;
                  iVar4 = iVar4 + 4;
                } while (w != lVar12);
              }
              local_53f8 = local_53f8 + 1;
              pfVar7 = pfVar7 + w;
            } while (local_53f8 != h);
          }
        }
        else {
          dVar11 = (double)(long)w;
          local_5330 = (long)h;
          __ptr = malloc((long)dVar11 * local_5330 * 0x10);
          local_5308.octmin.octcnt = 4;
          local_5308.octmin._4_4_ = x + -2;
          local_5308.octmin.octaves._0_4_ = z + -2;
          local_5308.octmin.octaves._4_4_ = w + 5;
          local_5308.octmax.octcnt = h + 5;
          local_5308.octmax._4_8_ = 0x100000000;
          __nmemb = getMinCacheSize(g,4,local_5308.octmin.octaves._4_4_,1,local_5308.octmax.octcnt);
          if (__nmemb == 0) {
            piVar5 = (int *)0x0;
          }
          else {
            piVar5 = (int *)calloc(__nmemb,4);
          }
          r_00.x = local_5308.octmin._4_4_;
          r_00.scale = local_5308.octmin.octcnt;
          r_00.z = (int)local_5308.octmin.octaves;
          r_00.sx = local_5308.octmin.octaves._4_4_;
          r_00.sz = local_5308.octmax.octcnt;
          r_00._20_8_ = local_5308.octmax._4_8_;
          genBiomes(g,piVar5,r_00);
          if (h < 1) {
            free(piVar5);
          }
          else {
            local_5388 = 0;
            local_53b8 = 0;
            local_5360 = piVar5;
            do {
              if (0 < w) {
                local_5350 = (double)(local_53b8 + 2);
                local_5358 = (double)(local_53b8 * (long)dVar11);
                dVar24 = 0.0;
                piVar14 = piVar5;
                do {
                  iVar4 = piVar5[(long)local_5308.octmin.octaves._4_4_ * (long)local_5350 +
                                 (long)dVar24 + 2];
                  local_5340 = dVar24;
                  getBiomeDepthAndScale(iVar4,local_5378,&local_5328,(int *)0x0);
                  dVar24 = 0.0;
                  dVar25 = 0.0;
                  dVar26 = 0.0;
                  puVar10 = &DAT_0012e140;
                  lVar17 = 0;
                  lVar12 = local_5388;
                  do {
                    lVar9 = 0;
                    do {
                      getBiomeDepthAndScale
                                (*(int *)((long)piVar14 +
                                         lVar9 * 4 + local_5308.octmin.octaves._4_4_ * lVar12),
                                 &local_5310,&local_5318,(int *)0x0);
                      fVar23 = (float)((double)(float)puVar10[lVar9] / (local_5310 + 2.0));
                      fVar22 = fVar23 * 0.5;
                      if (local_5310 <= local_5378[0]) {
                        fVar22 = fVar23;
                      }
                      dVar1 = (double)fVar22;
                      dVar26 = dVar26 + dVar1;
                      dVar24 = dVar24 + dVar1 * local_5310;
                      dVar25 = dVar25 + dVar1 * local_5318;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 5);
                    lVar17 = lVar17 + 1;
                    puVar10 = puVar10 + 5;
                    lVar12 = lVar12 + 4;
                  } while (lVar17 != 5);
                  lVar12 = (long)local_5358 + (long)local_5340;
                  *(double *)((long)__ptr + lVar12 * 8) =
                       ((dVar24 / dVar26) * 4.0 + -1.0) * 0.125 * 17.0 * 0.015625;
                  *(double *)((long)__ptr + lVar12 * 8 + (long)(h * w) * 8) =
                       96.0 / ((dVar25 / dVar26) * 0.9 + 0.1);
                  if (ids != (int *)0x0) {
                    ids[lVar12] = iVar4;
                  }
                  dVar24 = (double)((long)local_5340 + 1);
                  piVar14 = piVar14 + 1;
                  piVar5 = local_5360;
                } while (dVar24 != dVar11);
              }
              local_53b8 = local_53b8 + 1;
              local_5388 = local_5388 + 4;
            } while (local_53b8 != local_5330);
            free(piVar5);
            if (0 < h) {
              local_5320 = &local_5348->octdepth;
              local_5368 = 0;
              do {
                pfVar7 = local_5338;
                if (0 < w) {
                  iVar4 = z + (int)local_5368;
                  local_5358 = (double)(iVar4 * 200);
                  piVar5 = (int *)(local_5368 * (long)dVar11);
                  dVar24 = 0.0;
                  local_5360 = piVar5;
                  do {
                    x_00 = x + SUB84(dVar24,0);
                    dVar25 = sampleOctaveAmp(local_5320,(double)(x_00 * 200),10.0,local_5358,1.0,0.0
                                             ,1);
                    dVar25 = dVar25 * 8.191875;
                    uVar20 = 0;
                    uVar21 = 0;
                    dVar26 = (double)(~-(ulong)(dVar25 < 0.0) & (ulong)dVar25 |
                                     (ulong)(dVar25 * -0.3) & -(ulong)(dVar25 < 0.0)) * 3.0 + -2.0;
                    dVar25 = 1.0;
                    if (dVar26 <= 1.0) {
                      dVar25 = dVar26;
                    }
                    local_5340 = dVar25 * 0.265625 *
                                 *(double *)(&DAT_0012e128 + (ulong)(dVar25 * 0.265625 < 0.0) * 8);
                    lVar12 = (long)dVar24 + (long)local_5360;
                    iVar8 = 0x20;
                    uVar15 = 0;
                    iVar6 = 8;
                    dVar25 = 0.0;
                    local_5350 = dVar24;
                    do {
                      dVar24 = (double)CONCAT44(uVar21,uVar20);
                      pdVar13 = local_5378;
                      lVar17 = 0;
                      bVar3 = true;
                      do {
                        bVar16 = bVar3;
                        uVar19 = lVar17 + iVar6;
                        iVar18 = (int)uVar19;
                        dVar26 = sampleSurfaceNoise(local_5348,x_00,iVar18,iVar4);
                        dVar1 = ((double)(iVar18 * 2) * -0.03125 + 1.0 + local_5340 + -0.46875 +
                                *(double *)((long)__ptr + lVar12 * 8)) *
                                *(double *)((long)__ptr + lVar12 * 8 + (long)(h * w) * 8);
                        dVar26 = (double)(~-(ulong)(0.0 < dVar1) & (ulong)dVar1 |
                                         (ulong)(dVar1 * 4.0) & -(ulong)(0.0 < dVar1)) + dVar26;
                        *pdVar13 = dVar26;
                        if (0.0 <= dVar26 && (long)(int)uVar15 < (long)uVar19) {
                          uVar15 = uVar19 & 0xffffffff;
                          dVar24 = dVar26;
                        }
                        if (dVar26 < 0.0 && (long)uVar19 < (long)iVar8) {
                          iVar8 = iVar18;
                          dVar25 = dVar26;
                        }
                        lVar17 = 1;
                        pdVar13 = &local_5328;
                        bVar3 = false;
                      } while (bVar16);
                      dVar26 = local_5378[0] / (local_5378[0] - local_5328);
                      if (dVar26 <= 0.0) {
                        dVar26 = floor(dVar26);
                        uVar20 = SUB84(dVar26,0);
                        uVar21 = (undefined4)((ulong)dVar26 >> 0x20);
                      }
                      else {
                        dVar26 = ceil(dVar26);
                        uVar20 = SUB84(dVar26,0);
                        uVar21 = (undefined4)((ulong)dVar26 >> 0x20);
                      }
                      iVar6 = iVar6 + (int)(double)CONCAT44(uVar21,uVar20);
                      iVar18 = (int)uVar15;
                      iVar2 = iVar18 + 1;
                      if (iVar18 < iVar6) {
                        iVar2 = iVar6;
                      }
                      iVar6 = iVar8 + -1;
                      if (iVar2 < iVar8) {
                        iVar6 = iVar2;
                      }
                      uVar20 = SUB84(dVar24,0);
                      uVar21 = (undefined4)((ulong)dVar24 >> 0x20);
                    } while (1 < iVar8 - iVar18);
                    pfVar7[(long)piVar5 + (long)local_5350] =
                         (float)(((double)iVar18 + dVar24 / (dVar24 - dVar25)) * 8.0);
                    dVar24 = (double)((long)local_5350 + 1);
                  } while (dVar24 != dVar11);
                }
                local_5368 = local_5368 + 1;
              } while (local_5368 != local_5330);
            }
          }
          free(__ptr);
        }
      }
      else {
        iVar4 = *(int *)((long)&g->field_5 + 0x6008);
        if ((iVar4 != 4) && (iVar4 != -1)) {
          return 1;
        }
        if (0 < h) {
          lVar12 = (long)w;
          local_53d8 = 0;
          piVar5 = ids;
          do {
            if (0 < w) {
              lVar17 = 0;
              do {
                iVar4 = sampleBiomeNoise((BiomeNoise *)&(g->field_5).field_0,(int64_t *)&local_5308,
                                         (int)lVar17 + x,0,(int)local_53d8 + z,(uint64_t *)0x0,0);
                if (ids != (int *)0x0) {
                  piVar5[lVar17] = iVar4;
                }
                y[lVar17] = (float)((double)(long)local_5308.octmain._0_8_ / 76.0);
                lVar17 = lVar17 + 1;
              } while (lVar12 != lVar17);
            }
            local_53d8 = local_53d8 + 1;
            piVar5 = piVar5 + lVar12;
            y = y + lVar12;
          } while (local_53d8 != h);
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mapApproxHeight(float *y, int *ids, const Generator *g, const SurfaceNoise *sn,
    int x, int z, int w, int h)
{
    if (g->dim == DIM_NETHER)
        return 127;

    if (g->dim == DIM_END)
    {
        if (g->mc <= MC_1_8)
            return 1;
        return mapEndSurfaceHeight(y, &g->en, sn, x, z, w, h, 4, 0);
    }

    if (g->mc >= MC_1_18)
    {
        if (g->bn.nptype != -1 && g->bn.nptype != NP_DEPTH)
            return 1;
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int flags = 0;//SAMPLE_NO_SHIFT;
                int64_t np[6];
                int id = sampleBiomeNoise(&g->bn, np, x+i, 0, z+j, 0, flags);
                if (ids)
                    ids[j*w+i] = id;
                y[j*w+i] = np[NP_DEPTH] / 76.0;
            }
        }
        return 0;
    }
    else if (g->mc <= MC_B1_7)
    {
        SurfaceNoiseBeta snb; // TODO: merge SurfaceNoise and SurfaceNoiseBeta?
        initSurfaceNoiseBeta(&snb, g->seed);
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int samplex = (x + i) * 4 + 2;
                int samplez = (z + j) * 4 + 2;
                // TODO: properly implement beta surface finder
                y[j*w+i] = approxSurfaceBeta(&g->bnb, &snb, samplex, samplez);
            }
        }
        return 0;
    }

    const float biome_kernel[25] = { // with 10 / (sqrt(i**2 + j**2) + 0.2)
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        4.545454545, 8.333333333, 50.00000000, 8.333333333, 4.545454545,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
    };

    double *depth = (double*) malloc(sizeof(double) * 2 * w * h);
    double *scale = depth + w * h;
    int64_t i, j;
    int ii, jj;

    Range r = {4, x-2, z-2, w+5, h+5, 0, 1};
    int *cache = allocCache(g, r);
    genBiomes(g, cache, r);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            double d0, s0;
            double wt = 0, ws = 0, wd = 0;
            int id0 = cache[(j+2)*r.sx + (i+2)];
            getBiomeDepthAndScale(id0, &d0, &s0, 0);

            for (jj = 0; jj < 5; jj++)
            {
                for (ii = 0; ii < 5; ii++)
                {
                    double d, s;
                    int id = cache[(j+jj)*r.sx + (i+ii)];
                    getBiomeDepthAndScale(id, &d, &s, 0);
                    float weight = biome_kernel[jj*5+ii] / (d + 2);
                    if (d > d0)
                        weight *= 0.5;
                    ws += s * weight;
                    wd += d * weight;
                    wt += weight;
                }
            }
            ws /= wt;
            wd /= wt;
            ws = ws * 0.9 + 0.1;
            wd = (wd * 4.0 - 1) / 8;
            ws = 96 / ws;
            wd = wd * 17./64;
            depth[j*w+i] = wd;
            scale[j*w+i] = ws;
            if (ids)
                ids[j*w+i] = id0;
        }
    }
    free(cache);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int px = x+i, pz = z+j;
            double off = sampleOctaveAmp(&sn->octdepth, px*200, 10, pz*200, 1, 0, 1);
            off *= 65535./8000;
            if (off < 0) off = -0.3 * off;
            off = off * 3 - 2;
            if (off > 1) off = 1;
            off *= 17./64;
            if (off < 0) off *= 1./28;
            else off *= 1./40;

            double vmin = 0, vmax = 0;
            int ytest = 8, ymin = 0, ymax = 32;
            do
            {
                double v[2];
                int k;
                for (k = 0; k < 2; k++)
                {
                    int py = ytest + k;
                    double n0 = sampleSurfaceNoise(sn, px, py, pz);
                    double fall = 1 - 2 * py / 32.0 + off - 0.46875;
                    fall = scale[j*w+i] * (fall + depth[j*w+i]);
                    n0 += (fall > 0 ? 4*fall : fall);
                    v[k] = n0;
                    if (n0 >= 0 && py > ymin)
                    {
                        ymin = py;
                        vmin = n0;
                    }
                    if (n0 < 0 && py < ymax)
                    {
                        ymax = py;
                        vmax = n0;
                    }
                }
                double dy = v[0] / (v[0] - v[1]);
                dy = (dy <= 0 ? floor(dy) : ceil(dy)); // round away from zero
                ytest += (int) dy;
                if (ytest <= ymin) ytest = ymin+1;
                if (ytest >= ymax) ytest = ymax-1;
            }
            while (ymax - ymin > 1);

            y[j*w+i] = 8 * (vmin / (double)(vmin - vmax) + ymin);
        }
    }
    free(depth);
    return 0;
}